

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

void * trico_open_archive_for_reading(uint8_t *data,uint64_t data_size)

{
  trico_archive *arch;
  
  arch = (trico_archive *)malloc(0x48);
  arch->data = (uint8_t *)0x0;
  arch->data_pointer = (uint8_t *)0x0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->buffer = (uint8_t *)0x0;
  arch->buffer_pointer = (uint8_t *)0x0;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->writable = 0;
  arch->data = data;
  arch->data_pointer = data;
  arch->data_size = data_size;
  if (((data_size < 4) || (data_size < 8)) || (*(int *)data != 0x6f637254)) {
    free(arch);
    arch = (trico_archive *)0x0;
  }
  else {
    arch->version = *(uint32_t *)(data + 4);
    arch->data_pointer = data + 8;
    read_next_stream_type(arch);
  }
  return arch;
}

Assistant:

void* trico_open_archive_for_reading(const uint8_t* data, uint64_t data_size)
  {
  struct trico_archive* arch = (struct trico_archive*)trico_malloc(sizeof(struct trico_archive));
  arch->buffer = NULL;
  arch->buffer_pointer = NULL;
  arch->data = NULL;
  arch->data_pointer = NULL;
  arch->version = 0;
  arch->next_stream_type = trico_empty;
  arch->buffer_size = 0;
  arch->data_size = 0;
  arch->size_available = 0;
  arch->writable = 0;

  arch->data = data;
  arch->data_pointer = arch->data;
  arch->data_size = data_size;
  if (!read_header(arch))
    {
    trico_free(arch);
    return NULL;
    }
  return arch;
  }